

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# perfetto.cc
# Opt level: O2

void perfetto::internal::TrackRegistry::InitializeInstance(void)

{
  bool bVar1;
  PlatformProcessId data;
  TrackRegistry *this;
  long lVar2;
  unsigned_long data_00;
  Uuid UVar3;
  string stat;
  base local_90 [8];
  unsigned_long local_88;
  StringSplitter splitter;
  string local_38;
  
  if (instance_ == (TrackRegistry *)0x0) {
    this = (TrackRegistry *)operator_new(0x58);
    TrackRegistry(this);
    stat._M_dataplus._M_p = (pointer)&stat.field_2;
    stat._M_string_length = 0;
    stat.field_2._M_local_buf[0] = '\0';
    instance_ = this;
    ::std::__cxx11::string::string<std::allocator<char>>
              ((string *)&splitter,"/proc/self/stat",(allocator<char> *)&local_38);
    bVar1 = base::ReadFile(&splitter.str_,&stat);
    ::std::__cxx11::string::~string((string *)&splitter);
    if ((bVar1) && (lVar2 = ::std::__cxx11::string::rfind((char *)&stat,0x38607a), lVar2 != -1)) {
      ::std::__cxx11::string::substr((ulong)&splitter,(ulong)&stat);
      ::std::__cxx11::string::operator=((string *)&stat,(string *)&splitter);
      ::std::__cxx11::string::~string((string *)&splitter);
      ::std::__cxx11::string::string((string *)&local_38,(string *)&stat);
      base::StringSplitter::StringSplitter(&splitter,&local_38,' ');
      ::std::__cxx11::string::~string((string *)&local_38);
      lVar2 = 0x15;
      data_00 = 0;
      do {
        lVar2 = lVar2 + -1;
        if (lVar2 == 0) {
          base::CStringToUInt64(local_90,splitter.cur_,10);
          data_00 = local_88;
          if (local_90[0] == (base)0x0) {
            data_00 = 0;
          }
          break;
        }
        bVar1 = base::StringSplitter::Next(&splitter);
      } while (bVar1);
      ::std::__cxx11::string::~string((string *)&splitter);
    }
    else {
      data_00 = 0;
    }
    ::std::__cxx11::string::~string((string *)&stat);
    if (data_00 == 0) {
      UVar3 = base::Uuidv4();
      Track::process_uuid._M_p = UVar3.data_._M_elems._0_8_;
    }
    else {
      splitter.str_._M_dataplus._M_p = (pointer)0xcbf29ce484222325;
      base::Hash::Update<unsigned_long,_true>((Hash *)&splitter,data_00);
      data = Platform::GetCurrentProcessId();
      base::Hash::Update<int,_true>((Hash *)&splitter,data);
      Track::process_uuid = splitter.str_._M_dataplus;
    }
  }
  return;
}

Assistant:

void TrackRegistry::InitializeInstance() {
  // TODO(eseckler): Chrome may call this more than once. Once Chrome doesn't
  // call this directly anymore, bring back DCHECK(!instance_) instead.
  if (instance_)
    return;
  instance_ = new TrackRegistry();

  // Use the process start time + pid as the unique identifier for this process.
  // This ensures that if there are two independent copies of the Perfetto SDK
  // in the same process (e.g., one in the app and another in a system
  // framework), events emitted by each will be consistently interleaved on
  // common thread and process tracks.
  if (uint64_t start_time = GetProcessStartTime()) {
    base::Hash hash;
    hash.Update(start_time);
    hash.Update(Platform::GetCurrentProcessId());
    Track::process_uuid = hash.digest();
  } else {
    // Fall back to a randomly generated identifier.
    Track::process_uuid = static_cast<uint64_t>(base::Uuidv4().lsb());
  }
}